

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_0::RenderCountCase::logAnalysis
          (RenderCountCase *this,
          vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
          *samples)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostringstream *poVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  long lVar4;
  long lVar5;
  pointer pSVar6;
  int precision;
  ulong uVar7;
  float val;
  LineParametersWithConfidence testParam;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> testSamples;
  string local_228;
  string local_208;
  LineParametersWithConfidence local_1e4;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_1c8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&local_1c8,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)local_1b0);
  pSVar6 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((samples->
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
      )._M_impl.super__Vector_impl_data._M_finish != pSVar6) {
    lVar5 = 0x10;
    uVar7 = 0;
    do {
      lVar4 = *(long *)((long)&pSVar6->nullTime + lVar5);
      local_1c8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar7].m_data[0] =
           (float)*(int *)((long)&pSVar6->baseTime + lVar5 + 4);
      local_1c8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar7].m_data[1] = (float)lVar4;
      uVar7 = uVar7 + 1;
      pSVar6 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x20;
    } while (uVar7 < (ulong)((long)(samples->
                                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6 >> 5))
    ;
  }
  deqp::gls::theilSenSiegelLinearRegression(&local_1e4,&local_1c8,0.6);
  val = 262144.0 / local_1e4.coefficient;
  paVar1 = &local_208.field_2;
  local_208._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Linear Regression","");
  paVar2 = &local_228.field_2;
  local_228._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Linear Regression","");
  tcu::LogSection::LogSection((LogSection *)local_1b0,&local_208,&local_228);
  tcu::TestLog::startSection
            ((TestLog *)&this_00->_M_allocated_capacity,(char *)local_1b0._0_8_,local_190._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  poVar3 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,
             "Offset & coefficient presented as [confidence interval min, estimate, confidence interval max]. Reported confidence interval for this test is "
             ,0x8e);
  std::ostream::_M_insert<double>(0.6000000238418579);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  poVar3 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Render time for scene with depth test was\n\t",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"[",1);
  std::ostream::_M_insert<double>((double)local_1e4.offsetConfidenceLower);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", ",2);
  std::ostream::_M_insert<double>((double)local_1e4.offset);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", ",2);
  std::ostream::_M_insert<double>((double)local_1e4.offsetConfidenceUpper);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"]us +",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"[",1);
  std::ostream::_M_insert<double>((double)local_1e4.coefficientConfidenceLower);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", ",2);
  std::ostream::_M_insert<double>((double)local_1e4.coefficient);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,", ",2);
  std::ostream::_M_insert<double>((double)local_1e4.coefficientConfidenceUpper);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"us/workload",0xb);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  tcu::TestLog::endSection((TestLog *)&this_00->_M_allocated_capacity);
  local_208._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Result","");
  local_228._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Result","");
  tcu::LogSection::LogSection((LogSection *)local_1b0,&local_208,&local_228);
  tcu::TestLog::startSection
            ((TestLog *)&this_00->_M_allocated_capacity,(char *)local_1b0._0_8_,local_190._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (0.0 <= local_1e4.coefficientConfidenceLower) {
    poVar3 = (ostringstream *)(local_1b0 + 8);
    if (local_1e4.coefficientConfidenceUpper * 0.25 <= local_1e4.coefficientConfidenceLower) {
      local_1b0._0_8_ = this_00;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,"Culled hidden pixels @ ",0x17);
      std::ostream::_M_insert<double>((double)val);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Mpx/s",5);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_138);
      de::floatToString_abi_cxx11_((string *)local_1b0,(de *)0x2,val,precision);
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,(string *)local_1b0);
    }
    else {
      local_1b0._0_8_ = this_00;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,
                 "Coefficient confidence range is extremely large, cannot give reliable result",0x4c
                );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_138);
      local_1b0._0_8_ = &local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Result confidence extremely low","");
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,(string *)local_1b0);
    }
  }
  else {
    poVar3 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,
               "Coefficient confidence bounds include values below 0.0, the operation likely has neglible per-pixel cost"
               ,0x68);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_138);
    local_1b0._0_8_ = &local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Pass","");
    tcu::ResultCollector::addResult
              (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,(string *)local_1b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection((TestLog *)&this_00->_M_allocated_capacity);
  if (local_1c8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void RenderCountCase::logAnalysis (const vector<Sample>& samples)
{
	using namespace gls;

	TestLog&		log			= m_testCtx.getLog();
	int				maxWorkload	= 0;
	vector<Vec2>	testSamples	(samples.size());

	for (size_t ndx = 0; ndx < samples.size(); ndx++)
	{
		const Sample& sample = samples[ndx];

		testSamples[ndx] = Vec2((float)sample.workload, (float)sample.testTime);

		maxWorkload = de::max(maxWorkload, sample.workload);
	}

	{
		const float							confidence	= 0.60f;
		const LineParametersWithConfidence	testParam	= theilSenSiegelLinearRegression(testSamples, confidence);
		const float							usPerCall	= testParam.coefficient;
		const float							pxPerCall	= RENDER_SIZE*RENDER_SIZE;
		const float							pxPerUs		= pxPerCall/usPerCall;
		const float							mpxPerS		= pxPerUs;

		log << TestLog::Section("Linear Regression", "Linear Regression");
		log << TestLog::Message << "Offset & coefficient presented as [confidence interval min, estimate, confidence interval max]. Reported confidence interval for this test is " << confidence << TestLog::EndMessage;
		log << TestLog::Message << "Render time for scene with depth test was\n\t"
			<< "[" << testParam.offsetConfidenceLower << ", " << testParam.offset <<  ", " << testParam.offsetConfidenceUpper << "]us +"
			<< "[" << testParam.coefficientConfidenceLower << ", " << testParam.coefficient << ", " << testParam.coefficientConfidenceUpper << "]"
			<< "us/workload" << TestLog::EndMessage;
		log << TestLog::EndSection;

		log << TestLog::Section("Result", "Result");

		if (testParam.coefficientConfidenceLower < 0.0f)
		{
			log << TestLog::Message << "Coefficient confidence bounds include values below 0.0, the operation likely has neglible per-pixel cost" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else if (testParam.coefficientConfidenceLower < testParam.coefficientConfidenceUpper*0.25)
		{
			log << TestLog::Message << "Coefficient confidence range is extremely large, cannot give reliable result" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, "Result confidence extremely low");
		}
		else
		{
			log << TestLog::Message << "Culled hidden pixels @ " << mpxPerS << "Mpx/s" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, de::floatToString(mpxPerS, 2));
		}

		log << TestLog::EndSection;
	}
}